

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O0

void x1_010_alloc_rom(void *chip,UINT32 memsize)

{
  void *pvVar1;
  x1_010_state *info;
  UINT32 memsize_local;
  void *chip_local;
  
  if (*(UINT32 *)((long)chip + 8) != memsize) {
    pvVar1 = realloc(*(void **)((long)chip + 0x10),(ulong)memsize);
    *(void **)((long)chip + 0x10) = pvVar1;
    *(UINT32 *)((long)chip + 8) = memsize;
    memset(*(void **)((long)chip + 0x10),0xff,(ulong)memsize);
  }
  return;
}

Assistant:

static void x1_010_alloc_rom(void* chip, UINT32 memsize)
{
	x1_010_state *info = (x1_010_state *)chip;
	
	if (info->ROMSize == memsize)
		return;
	
	info->rom = (UINT8*)realloc(info->rom, memsize);
	info->ROMSize = memsize;
	memset(info->rom, 0xFF, memsize);
	
	return;
}